

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ObjCheckEdge(Gia_Man_t *p,int iObj,int iNext)

{
  int iVar1;
  int iNext_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjHaveEdge(p,iObj,iNext);
  return iVar1;
}

Assistant:

int Gia_ObjCheckEdge( Gia_Man_t * p, int iObj, int iNext )
{
    return Gia_ObjHaveEdge( p, iObj, iNext );
}